

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCRef * NULLCTypeInfo::GetInstanceByType(NULLCRef *__return_storage_ptr__,TypeID id)

{
  char *pcVar1;
  TypeID id_local;
  
  memset(__return_storage_ptr__,0,0xc);
  if (id.typeID != 0) {
    pcVar1 = (char *)nullcAllocateTyped(id.typeID);
    __return_storage_ptr__->ptr = pcVar1;
    __return_storage_ptr__->typeID = id.typeID;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef GetInstanceByType(TypeID id)
	{
		NULLCRef r = { 0, 0 };

		if(!id.typeID)
			return r;

		r.ptr = (char*)nullcAllocateTyped(id.typeID);
		r.typeID = id.typeID;
		return r;
	}